

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# export_ostream.cpp
# Opt level: O0

void __thiscall
pstore::exchange::export_ns::ostream_base::ostream_base(ostream_base *this,size_t buffer_size)

{
  long value;
  unsigned_long *puVar1;
  char *pcVar2;
  size_type sVar3;
  unsigned_long local_20;
  size_t local_18;
  size_t buffer_size_local;
  ostream_base *this_local;
  
  this->_vptr_ostream_base = (_func_int **)&PTR___cxa_pure_virtual_003f7320;
  local_18 = buffer_size;
  buffer_size_local = (size_t)this;
  std::vector<char,_std::allocator<char>_>::vector(&this->buffer_);
  this->ptr_ = (char *)0x0;
  this->end_ = (char *)0x0;
  value = std::numeric_limits<long>::max();
  local_20 = unsigned_cast<long,unsigned_long,void>(value);
  puVar1 = std::min<unsigned_long>(&local_18,&local_20);
  std::vector<char,_std::allocator<char>_>::resize(&this->buffer_,*puVar1);
  pcVar2 = std::vector<char,_std::allocator<char>_>::data(&this->buffer_);
  this->ptr_ = pcVar2;
  pcVar2 = this->ptr_;
  sVar3 = std::vector<char,_std::allocator<char>_>::size(&this->buffer_);
  this->end_ = pcVar2 + sVar3;
  return;
}

Assistant:

ostream_base::ostream_base (std::size_t const buffer_size) {
                buffer_.resize (
                    std::min (buffer_size,
                              unsigned_cast (
                                  std::numeric_limits<gsl::span<char const>::index_type>::max ())));
                ptr_ = buffer_.data ();
                end_ = ptr_ + buffer_.size ();
            }